

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdFreeBlindHandle(void *handle,void *blind_handle)

{
  vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_> *this;
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *this_00;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *this_01;
  CfdCapiBlindTxData *blind_tx_struct;
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  if (blind_handle != (void *)0x0) {
    this = *(vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
             **)((long)blind_handle + 0x10);
    if (this != (vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                 *)0x0) {
      std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>::
      ~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)blind_handle + 0x10) = 0;
    }
    this_00 = *(vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> **)
               ((long)blind_handle + 0x18);
    if (this_00 !=
        (vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *)0x0) {
      std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::~vector
                (this_00);
      operator_delete(this_00);
      *(undefined8 *)((long)blind_handle + 0x18) = 0;
    }
    this_01 = *(vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> **)
               ((long)blind_handle + 0x38);
    if (this_01 != (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0) {
      std::vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_>::~vector(this_01);
      operator_delete(this_01);
      *(undefined8 *)((long)blind_handle + 0x38) = 0;
    }
  }
  std::__cxx11::string::string((string *)&local_38,"BlindTxData",&local_39);
  cfd::capi::FreeBuffer(blind_handle,&local_38,0x40);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeBlindHandle(void* handle, void* blind_handle) {
  try {
    cfd::Initialize();
    if (blind_handle != nullptr) {
      CfdCapiBlindTxData* blind_tx_struct =
          static_cast<CfdCapiBlindTxData*>(blind_handle);
      if (blind_tx_struct->txin_blind_keys != nullptr) {
        delete blind_tx_struct->txin_blind_keys;
        blind_tx_struct->txin_blind_keys = nullptr;
      }
      if (blind_tx_struct->txout_blind_keys != nullptr) {
        delete blind_tx_struct->txout_blind_keys;
        blind_tx_struct->txout_blind_keys = nullptr;
      }
      if (blind_tx_struct->blinder_list != nullptr) {
        delete blind_tx_struct->blinder_list;
        blind_tx_struct->blinder_list = nullptr;
      }
    }
    FreeBuffer(blind_handle, kPrefixBlindTxData, sizeof(CfdCapiBlindTxData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}